

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_sched.c
# Opt level: O1

void clock_setunit(_clock *x,double timeunit,int sampflag)

{
  t_float tVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = (double)(~-(ulong)(0.0 < timeunit) & 0x3ff0000000000000 |
                  (ulong)timeunit & -(ulong)(0.0 < timeunit));
  if (sampflag == 0) {
    dVar3 = (double)x->c_unit * 14112.0;
  }
  else {
    dVar3 = (double)-x->c_unit;
  }
  if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) {
    if (0.0 <= x->c_settime) {
      dVar3 = (double)x->c_unit;
      if (x->c_unit <= 0.0) {
        dVar3 = dVar3 * (14112000.0 / (double)(pd_maininstance.pd_stuff)->st_dacsr);
      }
      dVar3 = (x->c_settime - pd_maininstance.pd_systime) / dVar3;
    }
    else {
      dVar3 = -1.0;
    }
    if (sampflag == 0) {
      tVar1 = (t_float)(dVar2 * 14112.0);
    }
    else {
      tVar1 = -(float)dVar2;
    }
    x->c_unit = tVar1;
    if (0.0 <= dVar3) {
      dVar2 = (double)x->c_unit;
      if (x->c_unit <= 0.0) {
        dVar2 = dVar2 * (-14112000.0 / (double)(pd_maininstance.pd_stuff)->st_dacsr);
      }
      clock_set(x,dVar2 * dVar3 + pd_maininstance.pd_systime);
      return;
    }
  }
  return;
}

Assistant:

void clock_setunit(t_clock *x, double timeunit, int sampflag)
{
    double timeleft;
    if (timeunit <= 0)
        timeunit = 1;
    /* if no change, return to avoid truncation errors recalculating delay */
    if ((sampflag && (timeunit == -x->c_unit)) ||
        (!sampflag && (timeunit == x->c_unit * TIMEUNITPERMSEC)))
            return;

        /* figure out time left in the units we were in */
    timeleft = (x->c_settime < 0 ? -1 :
        (x->c_settime - pd_this->pd_systime)/((x->c_unit > 0)? x->c_unit :
            (x->c_unit*(TIMEUNITPERSECOND/STUFF->st_dacsr))));
    if (sampflag)
        x->c_unit = -timeunit;  /* negate to flag sample-based */
    else x->c_unit = timeunit * TIMEUNITPERMSEC;
    if (timeleft >= 0)  /* reschedule if already set */
        clock_delay(x, timeleft);
}